

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

void CopyPlane_16(uint16_t *src_y,int src_stride_y,uint16_t *dst_y,int dst_stride_y,int width,
                 int height)

{
  int iVar1;
  
  if (dst_stride_y == width && src_stride_y == width) {
    width = height * src_stride_y;
    height = 1;
    src_stride_y = 0;
    dst_stride_y = 0;
  }
  iVar1 = 0;
  if (0 < height) {
    iVar1 = height;
  }
  while (iVar1 != 0) {
    CopyRow_16_C(src_y,dst_y,width);
    dst_y = dst_y + dst_stride_y;
    src_y = src_y + src_stride_y;
    iVar1 = iVar1 + -1;
  }
  return;
}

Assistant:

LIBYUV_API
void CopyPlane_16(const uint16_t* src_y,
                  int src_stride_y,
                  uint16_t* dst_y,
                  int dst_stride_y,
                  int width,
                  int height) {
  int y;
  void (*CopyRow)(const uint16_t* src, uint16_t* dst, int width) = CopyRow_16_C;
  // Coalesce rows.
  if (src_stride_y == width && dst_stride_y == width) {
    width *= height;
    height = 1;
    src_stride_y = dst_stride_y = 0;
  }
#if defined(HAS_COPYROW_16_SSE2)
  if (TestCpuFlag(kCpuHasSSE2) && IS_ALIGNED(width, 32)) {
    CopyRow = CopyRow_16_SSE2;
  }
#endif
#if defined(HAS_COPYROW_16_ERMS)
  if (TestCpuFlag(kCpuHasERMS)) {
    CopyRow = CopyRow_16_ERMS;
  }
#endif
#if defined(HAS_COPYROW_16_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 32)) {
    CopyRow = CopyRow_16_NEON;
  }
#endif

  // Copy plane
  for (y = 0; y < height; ++y) {
    CopyRow(src_y, dst_y, width);
    src_y += src_stride_y;
    dst_y += dst_stride_y;
  }
}